

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutItem::operator=(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *pQVar1;
  QPlaceHolderItem *pQVar2;
  QDockAreaLayoutItem *in_RSI;
  QDockAreaLayoutItem *in_RDI;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffb8;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffc0;
  
  if (in_RDI != in_RSI) {
    in_RDI->widgetItem = in_RSI->widgetItem;
    pQVar1 = in_RDI->subinfo;
    if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_stack_ffffffffffffffc0);
      operator_delete(pQVar1,0x70);
    }
    if (in_RSI->subinfo == (QDockAreaLayoutInfo *)0x0) {
      in_RDI->subinfo = (QDockAreaLayoutInfo *)0x0;
    }
    else {
      pQVar1 = (QDockAreaLayoutInfo *)operator_new(0x70);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      in_RDI->subinfo = pQVar1;
    }
    pQVar2 = in_RDI->placeHolderItem;
    if (pQVar2 != (QPlaceHolderItem *)0x0) {
      QPlaceHolderItem::~QPlaceHolderItem((QPlaceHolderItem *)0x56d7e1);
      operator_delete(pQVar2,0x30);
    }
    if (in_RSI->placeHolderItem == (QPlaceHolderItem *)0x0) {
      in_RDI->placeHolderItem = (QPlaceHolderItem *)0x0;
    }
    else {
      pQVar2 = (QPlaceHolderItem *)operator_new(0x30);
      QPlaceHolderItem::QPlaceHolderItem(pQVar2,(QPlaceHolderItem *)in_stack_ffffffffffffffb8);
      in_RDI->placeHolderItem = pQVar2;
    }
    in_RDI->pos = in_RSI->pos;
    in_RDI->size = in_RSI->size;
    in_RDI->flags = in_RSI->flags;
  }
  return in_RDI;
}

Assistant:

QDockAreaLayoutItem
    &QDockAreaLayoutItem::operator = (const QDockAreaLayoutItem &other)
{
    if (this == &other)
        return *this;

    widgetItem = other.widgetItem;
    delete subinfo;
    if (other.subinfo == nullptr)
        subinfo = nullptr;
    else
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);

    delete placeHolderItem;
    if (other.placeHolderItem == nullptr)
        placeHolderItem = nullptr;
    else
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);

    pos = other.pos;
    size = other.size;
    flags = other.flags;

    return *this;
}